

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enable_shared_from_this4.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  shared_ptr<A> x;
  shared_ptr<A> p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  std::make_shared<A>();
  A::f((A *)(local_20 + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_20);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	shared_ptr<A> x = make_shared<A>();
	shared_ptr<A> p = x->f();
	return 0;
}